

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O0

adt_error_t adt_ary_resize(adt_ary_t *self,int32_t s32Len)

{
  adt_error_t local_1d;
  int32_t delta;
  adt_error_t result;
  int32_t s32Len_local;
  adt_ary_t *self_local;
  
  if ((self == (adt_ary_t *)0x0) || (s32Len < 0)) {
    self_local._7_1_ = '\x01';
  }
  else {
    local_1d = adt_ary_fill(self,s32Len);
    self_local._7_1_ = local_1d;
    if (local_1d == '\0') {
      if (s32Len < self->s32CurLen) {
        local_1d = adt_ary_splice(self,s32Len,self->s32CurLen - s32Len);
      }
      self_local._7_1_ = local_1d;
    }
  }
  return self_local._7_1_;
}

Assistant:

adt_error_t adt_ary_resize(adt_ary_t *self, int32_t s32Len)
{
   if ( (self != 0) && (s32Len >= 0) ) {
      adt_error_t result = adt_ary_fill(self,s32Len);
      if (result != ADT_NO_ERROR) {
         return result;
      }
      if (s32Len < self->s32CurLen) {
         int32_t delta = self->s32CurLen-s32Len;
         result = adt_ary_splice(self,s32Len,delta);
      }
      return result;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}